

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError str2offset(curl_off_t *val,char *str)

{
  char *pcVar1;
  int *piVar2;
  long lVar3;
  size_t sVar4;
  char *local_28;
  char *endptr;
  char *str_local;
  curl_off_t *val_local;
  
  if (*str == '-') {
    val_local._4_4_ = PARAM_NEGATIVE_NUMERIC;
  }
  else {
    endptr = str;
    str_local = (char *)val;
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(endptr,&local_28,0);
    *(long *)str_local = lVar3;
    if (((*(long *)str_local == -0x8000000000000000) || (*(long *)str_local == 0x7fffffffffffffff))
       && (piVar2 = __errno_location(), *piVar2 == 0x22)) {
      return PARAM_NUMBER_TOO_LARGE;
    }
    pcVar1 = endptr;
    if ((local_28 != endptr) && (sVar4 = strlen(endptr), local_28 == pcVar1 + sVar4)) {
      return PARAM_OK;
    }
    val_local._4_4_ = PARAM_BAD_NUMERIC;
  }
  return val_local._4_4_;
}

Assistant:

ParameterError str2offset(curl_off_t *val, const char *str)
{
  char *endptr;
  if(str[0] == '-')
    /* offsets aren't negative, this indicates weird input */
    return PARAM_NEGATIVE_NUMERIC;

#if(SIZEOF_CURL_OFF_T > SIZEOF_LONG)
  {
    CURLofft offt = curlx_strtoofft(str, &endptr, 0, val);
    if(CURL_OFFT_FLOW == offt)
      return PARAM_NUMBER_TOO_LARGE;
    else if(CURL_OFFT_INVAL == offt)
      return PARAM_BAD_NUMERIC;
  }
#else
  errno = 0;
  *val = strtol(str, &endptr, 0);
  if((*val == LONG_MIN || *val == LONG_MAX) && errno == ERANGE)
    return PARAM_NUMBER_TOO_LARGE;
#endif
  if((endptr != str) && (endptr == str + strlen(str)))
    return PARAM_OK;

  return PARAM_BAD_NUMERIC;
}